

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O0

sysbvm_tuple_t sysbvm_filesystem_absolute(sysbvm_context_t *context,sysbvm_tuple_t path)

{
  _Bool _Var1;
  char *__name;
  char *cstring;
  sysbvm_tuple_t left;
  sysbvm_tuple_t result;
  char *absolutePath;
  char *pathCString;
  sysbvm_tuple_t path_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isBytes(path);
  context_local = (sysbvm_context_t *)path;
  if ((_Var1) && (_Var1 = sysbvm_filesystem_isAbsolute(path), !_Var1)) {
    __name = sysbvm_tuple_bytesToCString(path);
    cstring = realpath(__name,(char *)0x0);
    free(__name);
    if (cstring == (char *)0x0) {
      left = sysbvm_filesystem_getWorkingDirectory(context);
      context_local = (sysbvm_context_t *)sysbvm_filesystem_joinPath(context,left,path);
    }
    else {
      context_local = (sysbvm_context_t *)sysbvm_string_createWithCString(context,cstring);
      free(cstring);
    }
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_filesystem_absolute(sysbvm_context_t *context, sysbvm_tuple_t path)
{
    (void)context;
    if(!sysbvm_tuple_isBytes(path) || sysbvm_filesystem_isAbsolute(path))
        return path;

#ifdef _WIN32
    return path;
#else
    char *pathCString = sysbvm_tuple_bytesToCString(path);
    char *absolutePath = realpath(pathCString, NULL);
    free(pathCString);
    if(!absolutePath)
        return sysbvm_filesystem_joinPath(context, sysbvm_filesystem_getWorkingDirectory(context), path);

    sysbvm_tuple_t result = sysbvm_string_createWithCString(context, absolutePath);
    free(absolutePath);
    return result;
#endif
}